

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_parse_signature_algorithms_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  mbedtls_md_type_t mVar1;
  mbedtls_md_type_t mVar2;
  mbedtls_md_type_t *local_48;
  int *md_cur;
  uchar *end;
  uchar *p;
  size_t sig_alg_list_size;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  if (((long)(int)(uint)CONCAT11(*buf,buf[1]) + 2U == len) &&
     (((long)(int)(uint)CONCAT11(*buf,buf[1]) & 1U) == 0)) {
    for (local_48 = (mbedtls_md_type_t *)ssl->conf->sig_hashes; *local_48 != MBEDTLS_MD_NONE;
        local_48 = local_48 + 1) {
      for (end = buf + 2; end < buf + len; end = end + 2) {
        mVar1 = *local_48;
        mVar2 = mbedtls_ssl_md_alg_from_hash(*end);
        if (mVar1 == mVar2) {
          ssl->handshake->sig_alg = (uint)*end;
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0xe4,"client hello v3, signature_algorithm ext: %d",
                     (ulong)(uint)ssl->handshake->sig_alg);
          return 0;
        }
      }
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xdf,"no signature_algorithm in common");
    ssl_local._4_4_ = 0;
  }
  else {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xcb,"bad client hello message");
    ssl_local._4_4_ = -0x7900;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_signature_algorithms_ext( mbedtls_ssl_context *ssl,
                                               const unsigned char *buf,
                                               size_t len )
{
    size_t sig_alg_list_size;
    const unsigned char *p;
    const unsigned char *end = buf + len;
    const int *md_cur;


    sig_alg_list_size = ( ( buf[0] << 8 ) | ( buf[1] ) );
    if( sig_alg_list_size + 2 != len ||
        sig_alg_list_size % 2 != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
    }

    /*
     * For now, ignore the SignatureAlgorithm part and rely on offered
     * ciphersuites only for that part. To be fixed later.
     *
     * So, just look at the HashAlgorithm part.
     */
    for( md_cur = ssl->conf->sig_hashes; *md_cur != MBEDTLS_MD_NONE; md_cur++ ) {
        for( p = buf + 2; p < end; p += 2 ) {
            if( *md_cur == (int) mbedtls_ssl_md_alg_from_hash( p[0] ) ) {
                ssl->handshake->sig_alg = p[0];
                goto have_sig_alg;
            }
        }
    }

    /* Some key echanges do not need signatures at all */
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "no signature_algorithm in common" ) );
    return( 0 );

have_sig_alg:
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "client hello v3, signature_algorithm ext: %d",
                   ssl->handshake->sig_alg ) );

    return( 0 );
}